

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O2

void skiwi::inline_fixnum_to_flonum(asmcode *code,compiler_options *param_2)

{
  operand oVar1;
  operand local_48;
  operand local_44;
  operand local_40;
  operand local_3c;
  uint64_t header;
  
  header = CONCAT44(header._4_4_,0x4e);
  local_48 = NUMBER;
  local_40 = AL;
  local_44 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&header,&local_44,&local_48,(int *)&local_40);
  header = CONCAT44(header._4_4_,0xb);
  local_44 = XMM0;
  local_48 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&header,&local_44,&local_48);
  header = 0x100000000000001;
  local_40 = RBP;
  local_48 = RBX;
  local_44 = ST6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_44,&local_48,&local_40);
  local_44 = XMM6;
  local_3c = CL;
  local_48 = RBX;
  local_40 = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_44,&local_48,&local_40,(int *)&local_3c);
  oVar1 = RAX;
  local_48 = oVar1;
  local_44 = ST6;
  local_40 = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,&local_44,&local_48,&local_40,&header);
  local_44 = ST6;
  local_48 = MEM_RBP;
  local_40 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_44,&local_48,&local_40);
  local_44 = ST7;
  local_40 = DH;
  local_3c = XMM0;
  local_48 = MEM_RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_44,&local_48,(int *)&local_40,&local_3c);
  local_44 = EMPTY;
  local_48 = RBP;
  local_40 = NUMBER;
  local_3c = local_48;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_44,&local_48,&local_40,(int *)&local_3c);
  local_44 = ST6;
  local_40 = RBX;
  local_48 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_44,&local_48,&local_40);
  return;
}

Assistant:

void inline_fixnum_to_flonum(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::SAR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::CVTSI2SD, ASM::asmcode::XMM0, ASM::asmcode::RAX);
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVQ, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }